

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ClassType::populate(ClassType *this,Scope *scope,ClassDeclarationSyntax *syntax)

{
  Scope *this_00;
  TokenKind TVar1;
  Symbol *pSVar2;
  size_t sVar3;
  pointer ppMVar4;
  Compilation *this_01;
  Type *returnType;
  Type *returnType_00;
  SymbolIndex SVar5;
  VariableSymbol *pVVar6;
  long lVar7;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view funcName;
  string_view funcName_00;
  string_view funcName_01;
  string_view funcName_02;
  string_view funcName_03;
  string_view funcName_04;
  string_view funcName_05;
  string_view funcName_06;
  anon_class_40_5_ecee1c2a makeFunc;
  optional<slang::ast::MethodBuilder> constraint_mode;
  optional<slang::ast::MethodBuilder> rand_mode;
  optional<slang::ast::MethodBuilder> srandom;
  optional<slang::ast::MethodBuilder> set_randstate;
  SubroutineKind in_stack_fffffffffffffc60;
  anon_class_1_0_00000001 local_391;
  _Storage<slang::SVInt,_false> local_390;
  char local_380;
  _Storage<slang::SVInt,_false> local_378;
  char local_368;
  _Storage<slang::SVInt,_false> local_360;
  char local_350;
  _Storage<slang::SVInt,_false> local_348;
  char local_338;
  ClassDeclarationSyntax *local_330;
  Type *local_328;
  VariableLifetime local_31c;
  anon_class_40_5_ecee1c2a local_318;
  optional<slang::ast::MethodBuilder> local_2f0;
  optional<slang::ast::MethodBuilder> local_298;
  optional<slang::ast::MethodBuilder> local_240;
  optional<slang::ast::MethodBuilder> local_1e8;
  optional<slang::ast::MethodBuilder> local_190;
  optional<slang::ast::MethodBuilder> local_138;
  optional<slang::ast::MethodBuilder> local_e0;
  optional<slang::ast::MethodBuilder> local_88;
  
  pSVar2 = (this->super_Scope).lastMember;
  SVar5 = 1;
  if (pSVar2 != (Symbol *)0x0) {
    SVar5 = pSVar2->indexInScope + 1;
  }
  this->headerIndex = SVar5;
  TVar1 = (syntax->virtualOrInterface).kind;
  if (TVar1 == InterfaceKeyword) {
    this->isInterface = true;
  }
  else if (TVar1 == VirtualKeyword) {
    this->isAbstract = true;
  }
  if ((syntax->finalSpecifier != (ClassSpecifierSyntax *)0x0) &&
     ((syntax->finalSpecifier->keyword).kind == FinalKeyword)) {
    this->isFinal = true;
  }
  this_00 = &this->super_Scope;
  (this->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  sVar3 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  local_330 = syntax;
  if (sVar3 != 0) {
    ppMVar4 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar7 = 0;
    do {
      Scope::addMembers(this_00,*(SyntaxNode **)((long)ppMVar4 + lVar7));
      lVar7 = lVar7 + 8;
    } while (sVar3 << 3 != lVar7);
  }
  this_01 = (this->super_Scope).compilation;
  returnType = this_01->voidType;
  returnType_00 = this_01->intType;
  local_328 = this_01->stringType;
  local_318.scopeNameMap = (this->super_Scope).nameMap;
  local_318.checkOverride = &local_391;
  funcName._M_str = "randomize";
  funcName._M_len = 9;
  local_318.scope = scope;
  local_318.comp = this_01;
  local_318.this = this;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_88,&local_318,funcName,returnType_00,false,
             (bitmask<slang::ast::MethodFlags>)0x401,in_stack_fffffffffffffc60);
  if (local_88.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_88.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_88);
  }
  funcName_00._M_str = "pre_randomize";
  funcName_00._M_len = 0xd;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_e0,&local_318,funcName_00,returnType,true,(bitmask<slang::ast::MethodFlags>)0x0,
             in_stack_fffffffffffffc60);
  if (local_e0.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_e0.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_e0);
  }
  funcName_01._M_str = "post_randomize";
  funcName_01._M_len = 0xe;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_138,&local_318,funcName_01,returnType,true,(bitmask<slang::ast::MethodFlags>)0x0
             ,in_stack_fffffffffffffc60);
  if (local_138.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_138.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_138);
  }
  funcName_02._M_str = "get_randstate";
  funcName_02._M_len = 0xd;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_190,&local_318,funcName_02,local_328,false,(bitmask<slang::ast::MethodFlags>)0x0
             ,in_stack_fffffffffffffc60);
  if (local_190.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_190.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_190);
  }
  funcName_03._M_str = "set_randstate";
  funcName_03._M_len = 0xd;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_1e8,&local_318,funcName_03,returnType,false,
             (bitmask<slang::ast::MethodFlags>)0x0,in_stack_fffffffffffffc60);
  if (local_1e8.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged != false) {
    local_338 = '\0';
    name._M_str = "state";
    name._M_len = 5;
    MethodBuilder::addArg
              ((MethodBuilder *)&local_1e8,name,local_328,In,
               (optional<slang::SVInt> *)&local_348._M_value);
    if ((local_338 == '\x01') &&
       (((local_338 = '\0', 0x40 < local_348._M_value.super_SVIntStorage.bitWidth ||
         ((local_348._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
        (local_348._M_value.super_SVIntStorage.field_0.val != 0)))) {
      operator_delete__((void *)local_348._M_value.super_SVIntStorage.field_0);
    }
  }
  funcName_04._M_str = "srandom";
  funcName_04._M_len = 7;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_240,&local_318,funcName_04,returnType,false,
             (bitmask<slang::ast::MethodFlags>)0x0,in_stack_fffffffffffffc60);
  if (local_240.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_350 = '\0';
    name_00._M_str = "seed";
    name_00._M_len = 4;
    MethodBuilder::addArg
              ((MethodBuilder *)&local_240,name_00,returnType_00,In,
               (optional<slang::SVInt> *)&local_360._M_value);
    if (((local_350 == '\x01') &&
        ((local_350 = '\0', 0x40 < local_360._M_value.super_SVIntStorage.bitWidth ||
         ((local_360._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
       (local_360._M_value.super_SVIntStorage.field_0.val != 0)) {
      operator_delete__((void *)local_360._M_value.super_SVIntStorage.field_0);
    }
  }
  funcName_05._M_str = "rand_mode";
  funcName_05._M_len = 9;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_298,&local_318,funcName_05,returnType,false,
             (bitmask<slang::ast::MethodFlags>)0x0,in_stack_fffffffffffffc60);
  if (local_298.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_368 = '\0';
    name_01._M_str = "on_ff";
    name_01._M_len = 5;
    MethodBuilder::addArg
              ((MethodBuilder *)&local_298,name_01,this_01->bitType,In,
               (optional<slang::SVInt> *)&local_378._M_value);
    if (((local_368 == '\x01') &&
        ((local_368 = '\0', 0x40 < local_378._M_value.super_SVIntStorage.bitWidth ||
         ((local_378._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
       (local_378._M_value.super_SVIntStorage.field_0.val != 0)) {
      operator_delete__((void *)local_378._M_value.super_SVIntStorage.field_0);
    }
  }
  funcName_06._M_str = "constraint_mode";
  funcName_06._M_len = 0xf;
  populate::anon_class_40_5_ecee1c2a::operator()
            (&local_2f0,&local_318,funcName_06,returnType,false,
             (bitmask<slang::ast::MethodFlags>)0x0,in_stack_fffffffffffffc60);
  if (local_2f0.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_380 = '\0';
    name_02._M_str = "on_ff";
    name_02._M_len = 5;
    MethodBuilder::addArg
              ((MethodBuilder *)&local_2f0,name_02,this_01->bitType,In,
               (optional<slang::SVInt> *)&local_390._M_value);
    if ((local_380 == '\x01') &&
       (((local_380 = '\0', 0x40 < local_390._M_value.super_SVIntStorage.bitWidth ||
         ((local_390._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
        (local_390._M_value.super_SVIntStorage.field_0.val != 0)))) {
      operator_delete__((void *)local_390._M_value.super_SVIntStorage.field_0);
    }
  }
  local_31c = Automatic;
  pVVar6 = BumpAllocator::
           emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation&,slang::ast::VariableLifetime>
                     (&this_01->super_BumpAllocator,(char (*) [5])"this",
                      &(this->super_Type).super_Symbol.location,&local_31c);
  (pVVar6->super_ValueSymbol).declaredType.type = &this->super_Type;
  *(byte *)&(pVVar6->flags).m_bits = (byte)(pVVar6->flags).m_bits | 3;
  (pVVar6->super_ValueSymbol).super_Symbol.parentScope = this_00;
  this->thisVar = pVVar6;
  if (local_330->implementsClause != (ImplementsClauseSyntax *)0x0 ||
      local_330->extendsClause != (ExtendsClauseSyntax *)0x0) {
    Scope::getOrAddDeferredData(this_00);
  }
  if (local_2f0.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_2f0.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_2f0);
  }
  if (local_298.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_298.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_298);
  }
  if (local_240.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_240.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_240);
  }
  if (local_1e8.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
      super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
      super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged == true) {
    local_1e8.super__Optional_base<slang::ast::MethodBuilder,_false,_false>._M_payload.
    super__Optional_payload<slang::ast::MethodBuilder,_true,_false,_false>.
    super__Optional_payload_base<slang::ast::MethodBuilder>._M_engaged = false;
    MethodBuilder::~MethodBuilder((MethodBuilder *)&local_1e8);
  }
  return;
}

Assistant:

void ClassType::populate(const Scope& scope, const ClassDeclarationSyntax& syntax) {
    // Save the current member index -- for generic classes, this is the location that
    // can see all parameter members but nothing else. This is needed to correctly
    // resolve type parameters used in extends and implements clauses.
    if (auto last = getLastMember())
        headerIndex = last->getIndex() + 1;
    else
        headerIndex = SymbolIndex(1);

    if (syntax.virtualOrInterface.kind == TokenKind::VirtualKeyword)
        isAbstract = true;
    else if (syntax.virtualOrInterface.kind == TokenKind::InterfaceKeyword)
        isInterface = true;

    if (syntax.finalSpecifier && syntax.finalSpecifier->keyword.kind == TokenKind::FinalKeyword)
        isFinal = true;

    setSyntax(syntax);
    for (auto member : syntax.items)
        addMembers(*member);

    // All class types get some built-in methods.
    auto& comp = getCompilation();
    auto& void_t = comp.getVoidType();
    auto& int_t = comp.getIntType();
    auto& string_t = comp.getStringType();

    auto checkOverride = [](auto& s) {
        return s.subroutineKind == SubroutineKind::Function && s.getArguments().empty() &&
               s.getReturnType().isVoid() && s.visibility == Visibility::Public &&
               s.flags == MethodFlags::None;
    };

    auto& scopeNameMap = getUnelaboratedNameMap();
    auto makeFunc = [&](std::string_view funcName, const Type& returnType, bool allowOverride,
                        bitmask<MethodFlags> extraFlags = MethodFlags::None,
                        SubroutineKind subroutineKind =
                            SubroutineKind::Function) -> std::optional<MethodBuilder> {
        if (auto it = scopeNameMap.find(funcName); it != scopeNameMap.end()) {
            auto existing = it->second;
            if (allowOverride) {
                bool ok = false;
                if (existing->kind == SymbolKind::Subroutine)
                    ok = checkOverride(existing->as<SubroutineSymbol>());
                else if (existing->kind == SymbolKind::MethodPrototype)
                    ok = checkOverride(existing->as<MethodPrototypeSymbol>());

                if (!ok)
                    scope.addDiag(diag::InvalidRandomizeOverride, existing->location) << funcName;
            }
            else {
                scope.addDiag(diag::InvalidMethodOverride, existing->location) << funcName;
            }
            return {};
        }

        MethodBuilder builder(comp, funcName, returnType, subroutineKind);
        builder.addFlags(extraFlags);
        addMember(builder.symbol);
        return builder;
    };

    makeFunc("randomize", int_t, false, MethodFlags::Virtual | MethodFlags::Randomize);
    makeFunc("pre_randomize", void_t, true);
    makeFunc("post_randomize", void_t, true);
    makeFunc("get_randstate", string_t, false);

    auto set_randstate = makeFunc("set_randstate", void_t, false);
    if (set_randstate)
        set_randstate->addArg("state", string_t);

    auto srandom = makeFunc("srandom", void_t, false);
    if (srandom)
        srandom->addArg("seed", int_t);

    auto rand_mode = makeFunc("rand_mode", void_t, false, MethodFlags::None,
                              SubroutineKind::Function);
    if (rand_mode)
        rand_mode->addArg("on_ff", comp.getBitType());

    auto constraint_mode = makeFunc("constraint_mode", void_t, false, MethodFlags::None,
                                    SubroutineKind::Function);
    if (constraint_mode)
        constraint_mode->addArg("on_ff", comp.getBitType());

    // Give this class a "thisVar" that can be used by non-static class
    // property initializers to refer to their own instance.
    auto tv = comp.emplace<VariableSymbol>("this", location, VariableLifetime::Automatic);
    tv->setType(*this);
    tv->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;
    tv->setParent(*this);
    thisVar = tv;

    // This needs to happen last, otherwise setting "needs elaboration" before
    // trying to access the name map can cause infinite recursion.
    if (syntax.extendsClause || syntax.implementsClause)
        setNeedElaboration();
}